

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

zt_ptr_array * zt_ptr_array_init(void *args,zt_ptr_array_free_cb free_cb)

{
  void **ppvVar1;
  zt_ptr_array_free_cb in_RSI;
  void *in_RDI;
  zt_ptr_array *array;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  zt_ptr_array *local_8;
  
  local_8 = (zt_ptr_array *)zt_calloc_p(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (zt_ptr_array *)0x0) {
    local_8 = (zt_ptr_array *)0x0;
  }
  else {
    local_8->size = 0x20;
    local_8->args = in_RDI;
    local_8->free_cb = in_RSI;
    ppvVar1 = (void **)zt_malloc_p((size_t)local_8);
    local_8->array = ppvVar1;
    if (ppvVar1 == (void **)0x0) {
      if (local_8 != (zt_ptr_array *)0x0) {
        free(local_8);
      }
      local_8 = (zt_ptr_array *)0x0;
    }
  }
  return local_8;
}

Assistant:

zt_ptr_array *
zt_ptr_array_init(void * args, zt_ptr_array_free_cb free_cb) {
    zt_ptr_array * array;

    if (!(array = zt_calloc(zt_ptr_array, 1))) {
        return NULL;
    }

    array->size    = ZT_PTR_ARRAY_DEFAULT_SIZE;
    array->args    = args;
    array->free_cb = free_cb;

    if (!(array->array = (void **)zt_malloc(void **, array->size))) {
        zt_free(array);
        return NULL;
    }

    return array;
}